

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O3

int TestBuildFile(ICompilerLogger *pLog,RuntimeObjectSystem *pRTObjSys,Path *file,
                 ITestBuildNotifier *callback,bool bTestFileTracking)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 uVar5;
  pointer pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  stat buffer;
  utimbuf local_d0;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  iterator local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8 [4];
  _func_int **local_68;
  _func_int **pp_Var4;
  
  if (callback == (ITestBuildNotifier *)0x0) {
    __assert_fail("callback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/RuntimeObjectSystem.cpp"
                  ,0x380,
                  "int TestBuildFile(ICompilerLogger *, RuntimeObjectSystem *, const Path &, ITestBuildNotifier *, bool)"
                 );
  }
  if (pLog != (ICompilerLogger *)0x0) {
    (**(code **)(*(long *)pLog + 0x10))
              (pLog,"Testing change to file: %s\n",(file->m_string)._M_dataplus._M_p);
  }
  iVar2 = stat((file->m_string)._M_dataplus._M_p,(stat *)local_c0);
  if (iVar2 == 0) {
    if (bTestFileTracking) {
      time((time_t *)local_c0);
      iVar2 = stat((file->m_string)._M_dataplus._M_p,(stat *)local_c0);
      if (iVar2 != 0) {
        local_68 = (_func_int **)0x0;
      }
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((ulong)(local_c0 == (undefined1  [8])local_68) + (long)local_c0);
      local_c0 = (undefined1  [8])paVar7;
      local_b8._M_p = (pointer)paVar7;
      utime((file->m_string)._M_dataplus._M_p,(utimbuf *)local_c0);
      FileSystemUtils::Path::ParentPath((Path *)local_c0,file);
      local_d0.actime = (__time_t)paVar7;
      local_d0.modtime = (__time_t)paVar7;
      utime(local_b8._M_p,&local_d0);
      iVar2 = 0x32;
      do {
        iVar3 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                  _vptr_ITestBuildNotifier[0xb])(pRTObjSys);
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x30))
                  (0x3f800000,(long *)CONCAT44(extraout_var,iVar3));
        iVar3 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                  _vptr_ITestBuildNotifier[5])(pRTObjSys);
        if ((char)iVar3 != '\0') break;
        iVar3 = (*callback->_vptr_ITestBuildNotifier[3])(callback);
        if ((char)iVar3 == '\0') {
          local_c0 = (undefined1  [8])&PTR__Path_00119a10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_p == local_a8) {
            return -0xd1e;
          }
          operator_delete(local_b8._M_p,local_a8[0]._M_allocated_capacity + 1);
          return -0xd1e;
        }
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      local_c0 = (undefined1  [8])&PTR__Path_00119a10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p != local_a8) {
        operator_delete(local_b8._M_p,local_a8[0]._M_allocated_capacity + 1);
      }
    }
    else {
      AUDynArray<const_char_*>::AUDynArray((AUDynArray<const_char_*> *)local_c0,0);
      local_d0.actime = (__time_t)(file->m_string)._M_dataplus._M_p;
      if (local_b0._M_current == (char **)local_a8[0]._0_8_) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_b8,local_b0,
                   (char **)&local_d0);
      }
      else {
        *local_b0._M_current = (char *)local_d0.actime;
        local_b0._M_current = local_b0._M_current + 1;
      }
      (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier._vptr_ITestBuildNotifier
        [0x25])(pRTObjSys,local_c0);
      AUDynArray<const_char_*>::~AUDynArray((AUDynArray<const_char_*> *)local_c0);
    }
    iVar2 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
              _vptr_ITestBuildNotifier[5])(pRTObjSys);
    if ((char)iVar2 != '\0') {
      while (iVar2 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                       _vptr_ITestBuildNotifier[6])(pRTObjSys), (char)iVar2 == '\0') {
        iVar2 = (*callback->_vptr_ITestBuildNotifier[3])(callback);
        if ((char)iVar2 == '\0') {
          return -0xd1e;
        }
      }
      iVar2 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                _vptr_ITestBuildNotifier[9])(pRTObjSys);
      iVar3 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                _vptr_ITestBuildNotifier[7])(pRTObjSys);
      if ((char)iVar3 != '\0') {
        iVar2 = (*callback->_vptr_ITestBuildNotifier[2])
                          (callback,(file->m_string)._M_dataplus._M_p,0);
        if ((char)iVar2 != '\0') {
          return 0;
        }
        return -0xd1e;
      }
      iVar3 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                _vptr_ITestBuildNotifier[9])(pRTObjSys);
      if (iVar3 == iVar2) {
        uVar5 = 4;
      }
      else {
        uVar5 = 5;
      }
      iVar2 = (*callback->_vptr_ITestBuildNotifier[2])
                        (callback,(file->m_string)._M_dataplus._M_p,uVar5);
      cVar1 = (char)iVar2;
      goto LAB_0010f940;
    }
    pcVar6 = (file->m_string)._M_dataplus._M_p;
    pp_Var4 = callback->_vptr_ITestBuildNotifier;
    uVar5 = 3;
  }
  else {
    pcVar6 = (file->m_string)._M_dataplus._M_p;
    pp_Var4 = callback->_vptr_ITestBuildNotifier;
    uVar5 = 2;
  }
  iVar2 = (*pp_Var4[2])(callback,pcVar6,uVar5);
  cVar1 = (char)iVar2;
LAB_0010f940:
  iVar2 = -1;
  if (cVar1 != '\0') {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int TestBuildFile( ICompilerLogger* pLog, RuntimeObjectSystem* pRTObjSys, const Path& file,
                          ITestBuildNotifier* callback, bool bTestFileTracking )
{
    assert( callback );

    if( pLog ) { pLog->LogInfo("Testing change to file: %s\n", file.c_str()); }

    int numErrors = 0;
    if( file.Exists() )
    {
        if( bTestFileTracking )
        {
            FileSystemUtils::filetime_t currTime = FileSystemUtils::GetCurrentTime();
            FileSystemUtils::filetime_t oldModTime = file.GetLastWriteTime();
            if( currTime == oldModTime )
            {
                // some files may be auto-generated by the program, so may have just been created so won't
                // get a time change unless we force it.
                currTime += 1;
            }
            file.SetLastWriteTime( currTime );
            // we must also change the directories time, as some of our watchers watch the dir
            Path directory = file.ParentPath();
            directory.SetLastWriteTime( currTime );
            for( int i=0; i<50; ++i )
            {
                // wait up to 100 seconds (make configurable?)
                pRTObjSys->GetFileChangeNotifier()->Update( 1.0f ); // force update by using very large time delta
                if( pRTObjSys->GetIsCompiling() ) { break; }
                if( !callback->TestBuildWaitAndUpdate() )
                {
                    return -0xD1E;
                }
            }
        }
        else
        {
            AUDynArray<const char*> filelist;
            filelist.Add( file.c_str() );
            pRTObjSys->OnFileChange( filelist );
        }
        if( pRTObjSys->GetIsCompiling() )
        {
            while( !pRTObjSys->GetIsCompiledComplete() )
            {
                if( !callback->TestBuildWaitAndUpdate() )
                {
                    return -0xD1E;
                }
            }
            int numCurrLoadedModules = pRTObjSys->GetNumberLoadedModules();
            if( pRTObjSys->LoadCompiledModule() )
            {
                if( !callback->TestBuildCallback( file.c_str(), TESTBUILDRRESULT_SUCCESS ) ) { return -0xD1E; }
                return 0;
            }
            else
            {
                ++numErrors;
                if( (int)pRTObjSys->GetNumberLoadedModules() == numCurrLoadedModules )
                {
                    if( !callback->TestBuildCallback( file.c_str(), TESTBUILDRRESULT_BUILD_FAILED ) ) { return -numErrors; }
                }
                else
                {
                    // loaded the module but some other issue
                    if( !callback->TestBuildCallback( file.c_str(), TESTBUILDRRESULT_OBJECT_SWAP_FAIL ) ) { return -numErrors; }
                }
            }
        }
        else
        {
            ++numErrors;
           if( !callback->TestBuildCallback( file.c_str(), TESTBUILDRRESULT_BUILD_NOT_STARTED ) ) { return -numErrors; }
        }
    }
    else
    {
        ++numErrors;
        if( !callback->TestBuildCallback( file.c_str(), TESTBUILDRRESULT_BUILD_FILE_GONE ) ) { return -numErrors; }
    }
    return numErrors;
}